

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void write_unsigned_impl<unsigned_long_long>
               (raw_ostream *S,unsigned_long_long N,size_t MinDigits,IntegerStyle Style,
               bool IsNegative)

{
  int iVar1;
  char *pcVar2;
  undefined4 in_register_0000000c;
  ArrayRef<char> local_c8;
  ulong local_b8;
  size_t I;
  size_t Len;
  char NumberBuffer [128];
  bool IsNegative_local;
  IntegerStyle Style_local;
  size_t MinDigits_local;
  unsigned_long_long N_local;
  raw_ostream *S_local;
  
  NumberBuffer[0x7b] = IsNegative;
  NumberBuffer._124_4_ = Style;
  memset(&Len,0x30,0x80);
  I = 0;
  iVar1 = format_to_buffer<unsigned_long_long,128ul>(N,(char (*) [128])&Len);
  I = (size_t)iVar1;
  if ((NumberBuffer[0x7b] & 1U) != 0) {
    llvm::raw_ostream::operator<<(S,'-');
  }
  if ((I < MinDigits) && (NumberBuffer._124_4_ != 1)) {
    for (local_b8 = I; local_b8 < MinDigits; local_b8 = local_b8 + 1) {
      llvm::raw_ostream::operator<<(S,'0');
    }
  }
  if (NumberBuffer._124_4_ == 1) {
    pcVar2 = std::end<char,128ul>((char (*) [128])&Len);
    llvm::ArrayRef<char>::ArrayRef(&local_c8,pcVar2 + -I,I);
    writeWithCommas(S,local_c8);
  }
  else {
    pcVar2 = std::end<char,128ul>((char (*) [128])&Len);
    llvm::raw_ostream::write(S,(int)pcVar2 - (int)I,(void *)I,CONCAT44(in_register_0000000c,Style));
  }
  return;
}

Assistant:

static void write_unsigned_impl(raw_ostream &S, T N, size_t MinDigits,
                                IntegerStyle Style, bool IsNegative) {
  static_assert(std::is_unsigned<T>::value, "Value is not unsigned!");

  char NumberBuffer[128];
  std::memset(NumberBuffer, '0', sizeof(NumberBuffer));

  size_t Len = 0;
  Len = format_to_buffer(N, NumberBuffer);

  if (IsNegative)
    S << '-';

  if (Len < MinDigits && Style != IntegerStyle::Number) {
    for (size_t I = Len; I < MinDigits; ++I)
      S << '0';
  }

  if (Style == IntegerStyle::Number) {
    writeWithCommas(S, ArrayRef<char>(std::end(NumberBuffer) - Len, Len));
  } else {
    S.write(std::end(NumberBuffer) - Len, Len);
  }
}